

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

int __thiscall Parser::access(Parser *this,char *__name,int __type)

{
  undefined4 in_register_00000014;
  shared_ptr<Expression> local_70;
  shared_ptr<ElementAccess> local_60;
  undefined1 local_50 [8];
  ptr<Expression> expr;
  undefined1 local_30 [8];
  ptr<Expression> accessValue;
  ptr<Expression> *callee_local;
  Parser *this_local;
  
  accessValue.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_00000014,__type);
  consume((Parser *)__name);
  expression((Parser *)local_30);
  consume((Parser *)__name,RightBrack,"\']\'");
  make<ElementAccess,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
            ((shared_ptr<Expression> *)&local_60,
             (shared_ptr<Expression> *)CONCAT44(in_register_00000014,__type));
  std::shared_ptr<Expression>::shared_ptr<ElementAccess,void>
            ((shared_ptr<Expression> *)local_50,&local_60);
  std::shared_ptr<ElementAccess>::~shared_ptr(&local_60);
  std::shared_ptr<Expression>::shared_ptr(&local_70,(shared_ptr<Expression> *)local_50);
  postfix(this,(ptr<Expression> *)__name);
  std::shared_ptr<Expression>::~shared_ptr(&local_70);
  std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_50);
  std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_30);
  return (int)this;
}

Assistant:

ptr<Expression> Parser::access(ptr<Expression> callee) {
    consume();
    ptr<Expression> accessValue = expression();
    consume(TokenType::RightBrack, "']'");
    ptr<Expression> expr = make<ElementAccess>(callee, accessValue);
    return postfix(expr);
}